

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_math.c
# Opt level: O0

float swap_median(float *arr,int n)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int in_ESI;
  float *in_RDI;
  float t_124;
  float t_123;
  float t_122;
  float t_121;
  float t_120;
  float t_119;
  float t_118;
  float t_117;
  float t_116;
  float t_115;
  float t_114;
  float t_113;
  float t_112;
  float t_111;
  float t_110;
  float t_109;
  float t_108;
  float t_107;
  float t_106;
  float t_105;
  float t_104;
  float t_103;
  float t_102;
  float t_101;
  float t_100;
  float t_99;
  float t_98;
  float t_97;
  float t_96;
  float t_95;
  float t_94;
  float t_93;
  float t_92;
  float t_91;
  float t_90;
  float t_89;
  float t_88;
  float t_87;
  float t_86;
  float t_85;
  float t_84;
  float t_83;
  float t_82;
  float t_81;
  float t_80;
  float t_79;
  float t_78;
  float t_77;
  float t_76;
  float t_75;
  float t_74;
  float t_73;
  float t_72;
  float t_71;
  float t_70;
  float t_69;
  float t_68;
  float t_67;
  float t_66;
  float t_65;
  float t_64;
  float t_63;
  float t_62;
  float t_61;
  float t_60;
  float t_59;
  float t_58;
  float t_57;
  float t_56;
  float t_55;
  float t_54;
  float t_53;
  float t_52;
  float t_51;
  float t_50;
  float t_49;
  float t_48;
  float t_47;
  float t_46;
  float t_45;
  float t_44;
  float t_43;
  float t_42;
  float t_41;
  float t_40;
  float t_39;
  float t_38;
  float t_37;
  float t_36;
  float t_35;
  float t_34;
  float t_33;
  float t_32;
  float t_31;
  float t_30;
  float t_29;
  float t_28;
  float t_27;
  float t_26;
  float t_25;
  float t_24;
  float t_23;
  float t_22;
  float t_21;
  float t_20;
  float t_19;
  float t_18;
  float t_17;
  float t_16;
  float t_15;
  float t_14;
  float t_13;
  float t_12;
  float t_11;
  float t_10;
  float t_9;
  float t_8;
  float t_7;
  float t_6;
  float t_5;
  float t_4;
  float t_3;
  float t_2;
  float t_1;
  float t;
  int local_260;
  int local_25c;
  int local_250;
  int local_24c;
  float t_147;
  float t_146;
  float t_145;
  float t_144;
  float t_143;
  float t_142;
  float t_141;
  int hh;
  int ll;
  int middle;
  int median;
  int high;
  int low;
  float t_140;
  float t_139;
  float t_138;
  float t_137;
  float t_136;
  float t_135;
  float t_134;
  float t_133;
  float t_132;
  float t_131;
  float t_130;
  float t_129;
  float t_128;
  float t_127;
  float t_126;
  float t_125;
  
  switch(in_ESI) {
  case 3:
    if (in_RDI[1] <= *in_RDI && *in_RDI != in_RDI[1]) {
      fVar1 = *in_RDI;
      *in_RDI = in_RDI[1];
      in_RDI[1] = fVar1;
    }
    if (in_RDI[2] <= in_RDI[1] && in_RDI[1] != in_RDI[2]) {
      fVar1 = in_RDI[1];
      in_RDI[1] = in_RDI[2];
      in_RDI[2] = fVar1;
    }
    if (in_RDI[1] <= *in_RDI && *in_RDI != in_RDI[1]) {
      fVar1 = *in_RDI;
      *in_RDI = in_RDI[1];
      in_RDI[1] = fVar1;
    }
    t_125 = in_RDI[1];
    break;
  default:
    local_24c = 0;
    local_250 = in_ESI + -1;
    iVar2 = local_250 / 2;
    while (local_24c < local_250) {
      if (local_250 == local_24c + 1) {
        if (in_RDI[local_250] <= in_RDI[local_24c] && in_RDI[local_24c] != in_RDI[local_250]) {
          fVar1 = in_RDI[local_24c];
          in_RDI[local_24c] = in_RDI[local_250];
          in_RDI[local_250] = fVar1;
        }
        return in_RDI[iVar2];
      }
      iVar3 = (local_24c + local_250) / 2;
      if (in_RDI[local_250] <= in_RDI[iVar3] && in_RDI[iVar3] != in_RDI[local_250]) {
        fVar1 = in_RDI[iVar3];
        in_RDI[iVar3] = in_RDI[local_250];
        in_RDI[local_250] = fVar1;
      }
      if (in_RDI[local_250] <= in_RDI[local_24c] && in_RDI[local_24c] != in_RDI[local_250]) {
        fVar1 = in_RDI[local_24c];
        in_RDI[local_24c] = in_RDI[local_250];
        in_RDI[local_250] = fVar1;
      }
      if (in_RDI[local_24c] <= in_RDI[iVar3] && in_RDI[iVar3] != in_RDI[local_24c]) {
        fVar1 = in_RDI[iVar3];
        in_RDI[iVar3] = in_RDI[local_24c];
        in_RDI[local_24c] = fVar1;
      }
      fVar1 = in_RDI[iVar3];
      in_RDI[iVar3] = in_RDI[local_24c + 1];
      in_RDI[local_24c + 1] = fVar1;
      local_25c = local_24c + 1;
      local_260 = local_250;
      while( true ) {
        do {
          local_25c = local_25c + 1;
          iVar3 = local_260;
        } while (in_RDI[local_25c] <= in_RDI[local_24c] && in_RDI[local_24c] != in_RDI[local_25c]);
        do {
          local_260 = iVar3;
          iVar3 = local_260 + -1;
        } while (in_RDI[local_24c] <= in_RDI[iVar3] && in_RDI[iVar3] != in_RDI[local_24c]);
        if (iVar3 < local_25c) break;
        fVar1 = in_RDI[local_25c];
        in_RDI[local_25c] = in_RDI[iVar3];
        in_RDI[iVar3] = fVar1;
        local_260 = iVar3;
      }
      fVar1 = in_RDI[local_24c];
      in_RDI[local_24c] = in_RDI[iVar3];
      in_RDI[iVar3] = fVar1;
      if (iVar3 <= iVar2) {
        local_24c = local_25c;
      }
      if (iVar2 <= iVar3) {
        local_250 = local_260 + -2;
      }
    }
    t_125 = in_RDI[iVar2];
    break;
  case 5:
    if (in_RDI[1] <= *in_RDI && *in_RDI != in_RDI[1]) {
      fVar1 = *in_RDI;
      *in_RDI = in_RDI[1];
      in_RDI[1] = fVar1;
    }
    if (in_RDI[4] <= in_RDI[3] && in_RDI[3] != in_RDI[4]) {
      fVar1 = in_RDI[3];
      in_RDI[3] = in_RDI[4];
      in_RDI[4] = fVar1;
    }
    if (in_RDI[3] <= *in_RDI && *in_RDI != in_RDI[3]) {
      fVar1 = *in_RDI;
      *in_RDI = in_RDI[3];
      in_RDI[3] = fVar1;
    }
    if (in_RDI[4] <= in_RDI[1] && in_RDI[1] != in_RDI[4]) {
      fVar1 = in_RDI[1];
      in_RDI[1] = in_RDI[4];
      in_RDI[4] = fVar1;
    }
    if (in_RDI[2] <= in_RDI[1] && in_RDI[1] != in_RDI[2]) {
      fVar1 = in_RDI[1];
      in_RDI[1] = in_RDI[2];
      in_RDI[2] = fVar1;
    }
    if (in_RDI[3] <= in_RDI[2] && in_RDI[2] != in_RDI[3]) {
      fVar1 = in_RDI[2];
      in_RDI[2] = in_RDI[3];
      in_RDI[3] = fVar1;
    }
    if (in_RDI[2] <= in_RDI[1] && in_RDI[1] != in_RDI[2]) {
      fVar1 = in_RDI[1];
      in_RDI[1] = in_RDI[2];
      in_RDI[2] = fVar1;
    }
    t_125 = in_RDI[2];
    break;
  case 7:
    if (in_RDI[5] <= *in_RDI && *in_RDI != in_RDI[5]) {
      fVar1 = *in_RDI;
      *in_RDI = in_RDI[5];
      in_RDI[5] = fVar1;
    }
    if (in_RDI[3] <= *in_RDI && *in_RDI != in_RDI[3]) {
      fVar1 = *in_RDI;
      *in_RDI = in_RDI[3];
      in_RDI[3] = fVar1;
    }
    if (in_RDI[6] <= in_RDI[1] && in_RDI[1] != in_RDI[6]) {
      fVar1 = in_RDI[1];
      in_RDI[1] = in_RDI[6];
      in_RDI[6] = fVar1;
    }
    if (in_RDI[4] <= in_RDI[2] && in_RDI[2] != in_RDI[4]) {
      fVar1 = in_RDI[2];
      in_RDI[2] = in_RDI[4];
      in_RDI[4] = fVar1;
    }
    if (in_RDI[1] <= *in_RDI && *in_RDI != in_RDI[1]) {
      fVar1 = *in_RDI;
      *in_RDI = in_RDI[1];
      in_RDI[1] = fVar1;
    }
    if (in_RDI[5] <= in_RDI[3] && in_RDI[3] != in_RDI[5]) {
      fVar1 = in_RDI[3];
      in_RDI[3] = in_RDI[5];
      in_RDI[5] = fVar1;
    }
    if (in_RDI[6] <= in_RDI[2] && in_RDI[2] != in_RDI[6]) {
      fVar1 = in_RDI[2];
      in_RDI[2] = in_RDI[6];
      in_RDI[6] = fVar1;
    }
    if (in_RDI[3] <= in_RDI[2] && in_RDI[2] != in_RDI[3]) {
      fVar1 = in_RDI[2];
      in_RDI[2] = in_RDI[3];
      in_RDI[3] = fVar1;
    }
    if (in_RDI[6] <= in_RDI[3] && in_RDI[3] != in_RDI[6]) {
      fVar1 = in_RDI[3];
      in_RDI[3] = in_RDI[6];
      in_RDI[6] = fVar1;
    }
    if (in_RDI[5] <= in_RDI[4] && in_RDI[4] != in_RDI[5]) {
      fVar1 = in_RDI[4];
      in_RDI[4] = in_RDI[5];
      in_RDI[5] = fVar1;
    }
    if (in_RDI[4] <= in_RDI[1] && in_RDI[1] != in_RDI[4]) {
      fVar1 = in_RDI[1];
      in_RDI[1] = in_RDI[4];
      in_RDI[4] = fVar1;
    }
    if (in_RDI[3] <= in_RDI[1] && in_RDI[1] != in_RDI[3]) {
      fVar1 = in_RDI[1];
      in_RDI[1] = in_RDI[3];
      in_RDI[3] = fVar1;
    }
    if (in_RDI[4] <= in_RDI[3] && in_RDI[3] != in_RDI[4]) {
      fVar1 = in_RDI[3];
      in_RDI[3] = in_RDI[4];
      in_RDI[4] = fVar1;
    }
    t_125 = in_RDI[3];
    break;
  case 9:
    if (in_RDI[2] <= in_RDI[1] && in_RDI[1] != in_RDI[2]) {
      fVar1 = in_RDI[1];
      in_RDI[1] = in_RDI[2];
      in_RDI[2] = fVar1;
    }
    if (in_RDI[5] <= in_RDI[4] && in_RDI[4] != in_RDI[5]) {
      fVar1 = in_RDI[4];
      in_RDI[4] = in_RDI[5];
      in_RDI[5] = fVar1;
    }
    if (in_RDI[8] <= in_RDI[7] && in_RDI[7] != in_RDI[8]) {
      fVar1 = in_RDI[7];
      in_RDI[7] = in_RDI[8];
      in_RDI[8] = fVar1;
    }
    if (in_RDI[1] <= *in_RDI && *in_RDI != in_RDI[1]) {
      fVar1 = *in_RDI;
      *in_RDI = in_RDI[1];
      in_RDI[1] = fVar1;
    }
    if (in_RDI[4] <= in_RDI[3] && in_RDI[3] != in_RDI[4]) {
      fVar1 = in_RDI[3];
      in_RDI[3] = in_RDI[4];
      in_RDI[4] = fVar1;
    }
    if (in_RDI[7] <= in_RDI[6] && in_RDI[6] != in_RDI[7]) {
      fVar1 = in_RDI[6];
      in_RDI[6] = in_RDI[7];
      in_RDI[7] = fVar1;
    }
    if (in_RDI[2] <= in_RDI[1] && in_RDI[1] != in_RDI[2]) {
      fVar1 = in_RDI[1];
      in_RDI[1] = in_RDI[2];
      in_RDI[2] = fVar1;
    }
    if (in_RDI[5] <= in_RDI[4] && in_RDI[4] != in_RDI[5]) {
      fVar1 = in_RDI[4];
      in_RDI[4] = in_RDI[5];
      in_RDI[5] = fVar1;
    }
    if (in_RDI[8] <= in_RDI[7] && in_RDI[7] != in_RDI[8]) {
      fVar1 = in_RDI[7];
      in_RDI[7] = in_RDI[8];
      in_RDI[8] = fVar1;
    }
    if (in_RDI[3] <= *in_RDI && *in_RDI != in_RDI[3]) {
      fVar1 = *in_RDI;
      *in_RDI = in_RDI[3];
      in_RDI[3] = fVar1;
    }
    if (in_RDI[8] <= in_RDI[5] && in_RDI[5] != in_RDI[8]) {
      fVar1 = in_RDI[5];
      in_RDI[5] = in_RDI[8];
      in_RDI[8] = fVar1;
    }
    if (in_RDI[7] <= in_RDI[4] && in_RDI[4] != in_RDI[7]) {
      fVar1 = in_RDI[4];
      in_RDI[4] = in_RDI[7];
      in_RDI[7] = fVar1;
    }
    if (in_RDI[6] <= in_RDI[3] && in_RDI[3] != in_RDI[6]) {
      fVar1 = in_RDI[3];
      in_RDI[3] = in_RDI[6];
      in_RDI[6] = fVar1;
    }
    if (in_RDI[4] <= in_RDI[1] && in_RDI[1] != in_RDI[4]) {
      fVar1 = in_RDI[1];
      in_RDI[1] = in_RDI[4];
      in_RDI[4] = fVar1;
    }
    if (in_RDI[5] <= in_RDI[2] && in_RDI[2] != in_RDI[5]) {
      fVar1 = in_RDI[2];
      in_RDI[2] = in_RDI[5];
      in_RDI[5] = fVar1;
    }
    if (in_RDI[7] <= in_RDI[4] && in_RDI[4] != in_RDI[7]) {
      fVar1 = in_RDI[4];
      in_RDI[4] = in_RDI[7];
      in_RDI[7] = fVar1;
    }
    if (in_RDI[2] <= in_RDI[4] && in_RDI[4] != in_RDI[2]) {
      fVar1 = in_RDI[4];
      in_RDI[4] = in_RDI[2];
      in_RDI[2] = fVar1;
    }
    if (in_RDI[4] <= in_RDI[6] && in_RDI[6] != in_RDI[4]) {
      fVar1 = in_RDI[6];
      in_RDI[6] = in_RDI[4];
      in_RDI[4] = fVar1;
    }
    if (in_RDI[2] <= in_RDI[4] && in_RDI[4] != in_RDI[2]) {
      fVar1 = in_RDI[4];
      in_RDI[4] = in_RDI[2];
      in_RDI[2] = fVar1;
    }
    t_125 = in_RDI[4];
    break;
  case 0x19:
    if (in_RDI[1] <= *in_RDI && *in_RDI != in_RDI[1]) {
      fVar1 = *in_RDI;
      *in_RDI = in_RDI[1];
      in_RDI[1] = fVar1;
    }
    if (in_RDI[4] <= in_RDI[3] && in_RDI[3] != in_RDI[4]) {
      fVar1 = in_RDI[3];
      in_RDI[3] = in_RDI[4];
      in_RDI[4] = fVar1;
    }
    if (in_RDI[4] <= in_RDI[2] && in_RDI[2] != in_RDI[4]) {
      fVar1 = in_RDI[2];
      in_RDI[2] = in_RDI[4];
      in_RDI[4] = fVar1;
    }
    if (in_RDI[3] <= in_RDI[2] && in_RDI[2] != in_RDI[3]) {
      fVar1 = in_RDI[2];
      in_RDI[2] = in_RDI[3];
      in_RDI[3] = fVar1;
    }
    if (in_RDI[7] <= in_RDI[6] && in_RDI[6] != in_RDI[7]) {
      fVar1 = in_RDI[6];
      in_RDI[6] = in_RDI[7];
      in_RDI[7] = fVar1;
    }
    if (in_RDI[7] <= in_RDI[5] && in_RDI[5] != in_RDI[7]) {
      fVar1 = in_RDI[5];
      in_RDI[5] = in_RDI[7];
      in_RDI[7] = fVar1;
    }
    if (in_RDI[6] <= in_RDI[5] && in_RDI[5] != in_RDI[6]) {
      fVar1 = in_RDI[5];
      in_RDI[5] = in_RDI[6];
      in_RDI[6] = fVar1;
    }
    if (in_RDI[10] <= in_RDI[9] && in_RDI[9] != in_RDI[10]) {
      fVar1 = in_RDI[9];
      in_RDI[9] = in_RDI[10];
      in_RDI[10] = fVar1;
    }
    if (in_RDI[10] <= in_RDI[8] && in_RDI[8] != in_RDI[10]) {
      fVar1 = in_RDI[8];
      in_RDI[8] = in_RDI[10];
      in_RDI[10] = fVar1;
    }
    if (in_RDI[9] <= in_RDI[8] && in_RDI[8] != in_RDI[9]) {
      fVar1 = in_RDI[8];
      in_RDI[8] = in_RDI[9];
      in_RDI[9] = fVar1;
    }
    if (in_RDI[0xd] <= in_RDI[0xc] && in_RDI[0xc] != in_RDI[0xd]) {
      fVar1 = in_RDI[0xc];
      in_RDI[0xc] = in_RDI[0xd];
      in_RDI[0xd] = fVar1;
    }
    if (in_RDI[0xd] <= in_RDI[0xb] && in_RDI[0xb] != in_RDI[0xd]) {
      fVar1 = in_RDI[0xb];
      in_RDI[0xb] = in_RDI[0xd];
      in_RDI[0xd] = fVar1;
    }
    if (in_RDI[0xc] <= in_RDI[0xb] && in_RDI[0xb] != in_RDI[0xc]) {
      fVar1 = in_RDI[0xb];
      in_RDI[0xb] = in_RDI[0xc];
      in_RDI[0xc] = fVar1;
    }
    if (in_RDI[0x10] <= in_RDI[0xf] && in_RDI[0xf] != in_RDI[0x10]) {
      fVar1 = in_RDI[0xf];
      in_RDI[0xf] = in_RDI[0x10];
      in_RDI[0x10] = fVar1;
    }
    if (in_RDI[0x10] <= in_RDI[0xe] && in_RDI[0xe] != in_RDI[0x10]) {
      fVar1 = in_RDI[0xe];
      in_RDI[0xe] = in_RDI[0x10];
      in_RDI[0x10] = fVar1;
    }
    if (in_RDI[0xf] <= in_RDI[0xe] && in_RDI[0xe] != in_RDI[0xf]) {
      fVar1 = in_RDI[0xe];
      in_RDI[0xe] = in_RDI[0xf];
      in_RDI[0xf] = fVar1;
    }
    if (in_RDI[0x13] <= in_RDI[0x12] && in_RDI[0x12] != in_RDI[0x13]) {
      fVar1 = in_RDI[0x12];
      in_RDI[0x12] = in_RDI[0x13];
      in_RDI[0x13] = fVar1;
    }
    if (in_RDI[0x13] <= in_RDI[0x11] && in_RDI[0x11] != in_RDI[0x13]) {
      fVar1 = in_RDI[0x11];
      in_RDI[0x11] = in_RDI[0x13];
      in_RDI[0x13] = fVar1;
    }
    if (in_RDI[0x12] <= in_RDI[0x11] && in_RDI[0x11] != in_RDI[0x12]) {
      fVar1 = in_RDI[0x11];
      in_RDI[0x11] = in_RDI[0x12];
      in_RDI[0x12] = fVar1;
    }
    if (in_RDI[0x16] <= in_RDI[0x15] && in_RDI[0x15] != in_RDI[0x16]) {
      fVar1 = in_RDI[0x15];
      in_RDI[0x15] = in_RDI[0x16];
      in_RDI[0x16] = fVar1;
    }
    if (in_RDI[0x16] <= in_RDI[0x14] && in_RDI[0x14] != in_RDI[0x16]) {
      fVar1 = in_RDI[0x14];
      in_RDI[0x14] = in_RDI[0x16];
      in_RDI[0x16] = fVar1;
    }
    if (in_RDI[0x15] <= in_RDI[0x14] && in_RDI[0x14] != in_RDI[0x15]) {
      fVar1 = in_RDI[0x14];
      in_RDI[0x14] = in_RDI[0x15];
      in_RDI[0x15] = fVar1;
    }
    if (in_RDI[0x18] <= in_RDI[0x17] && in_RDI[0x17] != in_RDI[0x18]) {
      fVar1 = in_RDI[0x17];
      in_RDI[0x17] = in_RDI[0x18];
      in_RDI[0x18] = fVar1;
    }
    if (in_RDI[5] <= in_RDI[2] && in_RDI[2] != in_RDI[5]) {
      fVar1 = in_RDI[2];
      in_RDI[2] = in_RDI[5];
      in_RDI[5] = fVar1;
    }
    if (in_RDI[6] <= in_RDI[3] && in_RDI[3] != in_RDI[6]) {
      fVar1 = in_RDI[3];
      in_RDI[3] = in_RDI[6];
      in_RDI[6] = fVar1;
    }
    if (in_RDI[6] <= *in_RDI && *in_RDI != in_RDI[6]) {
      fVar1 = *in_RDI;
      *in_RDI = in_RDI[6];
      in_RDI[6] = fVar1;
    }
    if (in_RDI[3] <= *in_RDI && *in_RDI != in_RDI[3]) {
      fVar1 = *in_RDI;
      *in_RDI = in_RDI[3];
      in_RDI[3] = fVar1;
    }
    if (in_RDI[7] <= in_RDI[4] && in_RDI[4] != in_RDI[7]) {
      fVar1 = in_RDI[4];
      in_RDI[4] = in_RDI[7];
      in_RDI[7] = fVar1;
    }
    if (in_RDI[7] <= in_RDI[1] && in_RDI[1] != in_RDI[7]) {
      fVar1 = in_RDI[1];
      in_RDI[1] = in_RDI[7];
      in_RDI[7] = fVar1;
    }
    if (in_RDI[4] <= in_RDI[1] && in_RDI[1] != in_RDI[4]) {
      fVar1 = in_RDI[1];
      in_RDI[1] = in_RDI[4];
      in_RDI[4] = fVar1;
    }
    if (in_RDI[0xe] <= in_RDI[0xb] && in_RDI[0xb] != in_RDI[0xe]) {
      fVar1 = in_RDI[0xb];
      in_RDI[0xb] = in_RDI[0xe];
      in_RDI[0xe] = fVar1;
    }
    if (in_RDI[0xe] <= in_RDI[8] && in_RDI[8] != in_RDI[0xe]) {
      fVar1 = in_RDI[8];
      in_RDI[8] = in_RDI[0xe];
      in_RDI[0xe] = fVar1;
    }
    if (in_RDI[0xb] <= in_RDI[8] && in_RDI[8] != in_RDI[0xb]) {
      fVar1 = in_RDI[8];
      in_RDI[8] = in_RDI[0xb];
      in_RDI[0xb] = fVar1;
    }
    if (in_RDI[0xf] <= in_RDI[0xc] && in_RDI[0xc] != in_RDI[0xf]) {
      fVar1 = in_RDI[0xc];
      in_RDI[0xc] = in_RDI[0xf];
      in_RDI[0xf] = fVar1;
    }
    if (in_RDI[0xf] <= in_RDI[9] && in_RDI[9] != in_RDI[0xf]) {
      fVar1 = in_RDI[9];
      in_RDI[9] = in_RDI[0xf];
      in_RDI[0xf] = fVar1;
    }
    if (in_RDI[0xc] <= in_RDI[9] && in_RDI[9] != in_RDI[0xc]) {
      fVar1 = in_RDI[9];
      in_RDI[9] = in_RDI[0xc];
      in_RDI[0xc] = fVar1;
    }
    if (in_RDI[0x10] <= in_RDI[0xd] && in_RDI[0xd] != in_RDI[0x10]) {
      fVar1 = in_RDI[0xd];
      in_RDI[0xd] = in_RDI[0x10];
      in_RDI[0x10] = fVar1;
    }
    if (in_RDI[0x10] <= in_RDI[10] && in_RDI[10] != in_RDI[0x10]) {
      fVar1 = in_RDI[10];
      in_RDI[10] = in_RDI[0x10];
      in_RDI[0x10] = fVar1;
    }
    if (in_RDI[0xd] <= in_RDI[10] && in_RDI[10] != in_RDI[0xd]) {
      fVar1 = in_RDI[10];
      in_RDI[10] = in_RDI[0xd];
      in_RDI[0xd] = fVar1;
    }
    if (in_RDI[0x17] <= in_RDI[0x14] && in_RDI[0x14] != in_RDI[0x17]) {
      fVar1 = in_RDI[0x14];
      in_RDI[0x14] = in_RDI[0x17];
      in_RDI[0x17] = fVar1;
    }
    if (in_RDI[0x17] <= in_RDI[0x11] && in_RDI[0x11] != in_RDI[0x17]) {
      fVar1 = in_RDI[0x11];
      in_RDI[0x11] = in_RDI[0x17];
      in_RDI[0x17] = fVar1;
    }
    if (in_RDI[0x14] <= in_RDI[0x11] && in_RDI[0x11] != in_RDI[0x14]) {
      fVar1 = in_RDI[0x11];
      in_RDI[0x11] = in_RDI[0x14];
      in_RDI[0x14] = fVar1;
    }
    if (in_RDI[0x18] <= in_RDI[0x15] && in_RDI[0x15] != in_RDI[0x18]) {
      fVar1 = in_RDI[0x15];
      in_RDI[0x15] = in_RDI[0x18];
      in_RDI[0x18] = fVar1;
    }
    if (in_RDI[0x18] <= in_RDI[0x12] && in_RDI[0x12] != in_RDI[0x18]) {
      fVar1 = in_RDI[0x12];
      in_RDI[0x12] = in_RDI[0x18];
      in_RDI[0x18] = fVar1;
    }
    if (in_RDI[0x15] <= in_RDI[0x12] && in_RDI[0x12] != in_RDI[0x15]) {
      fVar1 = in_RDI[0x12];
      in_RDI[0x12] = in_RDI[0x15];
      in_RDI[0x15] = fVar1;
    }
    if (in_RDI[0x16] <= in_RDI[0x13] && in_RDI[0x13] != in_RDI[0x16]) {
      fVar1 = in_RDI[0x13];
      in_RDI[0x13] = in_RDI[0x16];
      in_RDI[0x16] = fVar1;
    }
    if (in_RDI[0x11] <= in_RDI[8] && in_RDI[8] != in_RDI[0x11]) {
      fVar1 = in_RDI[8];
      in_RDI[8] = in_RDI[0x11];
      in_RDI[0x11] = fVar1;
    }
    if (in_RDI[0x12] <= in_RDI[9] && in_RDI[9] != in_RDI[0x12]) {
      fVar1 = in_RDI[9];
      in_RDI[9] = in_RDI[0x12];
      in_RDI[0x12] = fVar1;
    }
    if (in_RDI[0x12] <= *in_RDI && *in_RDI != in_RDI[0x12]) {
      fVar1 = *in_RDI;
      *in_RDI = in_RDI[0x12];
      in_RDI[0x12] = fVar1;
    }
    if (in_RDI[9] <= *in_RDI && *in_RDI != in_RDI[9]) {
      fVar1 = *in_RDI;
      *in_RDI = in_RDI[9];
      in_RDI[9] = fVar1;
    }
    if (in_RDI[0x13] <= in_RDI[10] && in_RDI[10] != in_RDI[0x13]) {
      fVar1 = in_RDI[10];
      in_RDI[10] = in_RDI[0x13];
      in_RDI[0x13] = fVar1;
    }
    if (in_RDI[0x13] <= in_RDI[1] && in_RDI[1] != in_RDI[0x13]) {
      fVar1 = in_RDI[1];
      in_RDI[1] = in_RDI[0x13];
      in_RDI[0x13] = fVar1;
    }
    if (in_RDI[10] <= in_RDI[1] && in_RDI[1] != in_RDI[10]) {
      fVar1 = in_RDI[1];
      in_RDI[1] = in_RDI[10];
      in_RDI[10] = fVar1;
    }
    if (in_RDI[0x14] <= in_RDI[0xb] && in_RDI[0xb] != in_RDI[0x14]) {
      fVar1 = in_RDI[0xb];
      in_RDI[0xb] = in_RDI[0x14];
      in_RDI[0x14] = fVar1;
    }
    if (in_RDI[0x14] <= in_RDI[2] && in_RDI[2] != in_RDI[0x14]) {
      fVar1 = in_RDI[2];
      in_RDI[2] = in_RDI[0x14];
      in_RDI[0x14] = fVar1;
    }
    if (in_RDI[0xb] <= in_RDI[2] && in_RDI[2] != in_RDI[0xb]) {
      fVar1 = in_RDI[2];
      in_RDI[2] = in_RDI[0xb];
      in_RDI[0xb] = fVar1;
    }
    if (in_RDI[0x15] <= in_RDI[0xc] && in_RDI[0xc] != in_RDI[0x15]) {
      fVar1 = in_RDI[0xc];
      in_RDI[0xc] = in_RDI[0x15];
      in_RDI[0x15] = fVar1;
    }
    if (in_RDI[0x15] <= in_RDI[3] && in_RDI[3] != in_RDI[0x15]) {
      fVar1 = in_RDI[3];
      in_RDI[3] = in_RDI[0x15];
      in_RDI[0x15] = fVar1;
    }
    if (in_RDI[0xc] <= in_RDI[3] && in_RDI[3] != in_RDI[0xc]) {
      fVar1 = in_RDI[3];
      in_RDI[3] = in_RDI[0xc];
      in_RDI[0xc] = fVar1;
    }
    if (in_RDI[0x16] <= in_RDI[0xd] && in_RDI[0xd] != in_RDI[0x16]) {
      fVar1 = in_RDI[0xd];
      in_RDI[0xd] = in_RDI[0x16];
      in_RDI[0x16] = fVar1;
    }
    if (in_RDI[0x16] <= in_RDI[4] && in_RDI[4] != in_RDI[0x16]) {
      fVar1 = in_RDI[4];
      in_RDI[4] = in_RDI[0x16];
      in_RDI[0x16] = fVar1;
    }
    if (in_RDI[0xd] <= in_RDI[4] && in_RDI[4] != in_RDI[0xd]) {
      fVar1 = in_RDI[4];
      in_RDI[4] = in_RDI[0xd];
      in_RDI[0xd] = fVar1;
    }
    if (in_RDI[0x17] <= in_RDI[0xe] && in_RDI[0xe] != in_RDI[0x17]) {
      fVar1 = in_RDI[0xe];
      in_RDI[0xe] = in_RDI[0x17];
      in_RDI[0x17] = fVar1;
    }
    if (in_RDI[0x17] <= in_RDI[5] && in_RDI[5] != in_RDI[0x17]) {
      fVar1 = in_RDI[5];
      in_RDI[5] = in_RDI[0x17];
      in_RDI[0x17] = fVar1;
    }
    if (in_RDI[0xe] <= in_RDI[5] && in_RDI[5] != in_RDI[0xe]) {
      fVar1 = in_RDI[5];
      in_RDI[5] = in_RDI[0xe];
      in_RDI[0xe] = fVar1;
    }
    if (in_RDI[0x18] <= in_RDI[0xf] && in_RDI[0xf] != in_RDI[0x18]) {
      fVar1 = in_RDI[0xf];
      in_RDI[0xf] = in_RDI[0x18];
      in_RDI[0x18] = fVar1;
    }
    if (in_RDI[0x18] <= in_RDI[6] && in_RDI[6] != in_RDI[0x18]) {
      fVar1 = in_RDI[6];
      in_RDI[6] = in_RDI[0x18];
      in_RDI[0x18] = fVar1;
    }
    if (in_RDI[0xf] <= in_RDI[6] && in_RDI[6] != in_RDI[0xf]) {
      fVar1 = in_RDI[6];
      in_RDI[6] = in_RDI[0xf];
      in_RDI[0xf] = fVar1;
    }
    if (in_RDI[0x10] <= in_RDI[7] && in_RDI[7] != in_RDI[0x10]) {
      fVar1 = in_RDI[7];
      in_RDI[7] = in_RDI[0x10];
      in_RDI[0x10] = fVar1;
    }
    if (in_RDI[0x13] <= in_RDI[7] && in_RDI[7] != in_RDI[0x13]) {
      fVar1 = in_RDI[7];
      in_RDI[7] = in_RDI[0x13];
      in_RDI[0x13] = fVar1;
    }
    if (in_RDI[0x15] <= in_RDI[0xd] && in_RDI[0xd] != in_RDI[0x15]) {
      fVar1 = in_RDI[0xd];
      in_RDI[0xd] = in_RDI[0x15];
      in_RDI[0x15] = fVar1;
    }
    if (in_RDI[0x17] <= in_RDI[0xf] && in_RDI[0xf] != in_RDI[0x17]) {
      fVar1 = in_RDI[0xf];
      in_RDI[0xf] = in_RDI[0x17];
      in_RDI[0x17] = fVar1;
    }
    if (in_RDI[0xd] <= in_RDI[7] && in_RDI[7] != in_RDI[0xd]) {
      fVar1 = in_RDI[7];
      in_RDI[7] = in_RDI[0xd];
      in_RDI[0xd] = fVar1;
    }
    if (in_RDI[0xf] <= in_RDI[7] && in_RDI[7] != in_RDI[0xf]) {
      fVar1 = in_RDI[7];
      in_RDI[7] = in_RDI[0xf];
      in_RDI[0xf] = fVar1;
    }
    if (in_RDI[9] <= in_RDI[1] && in_RDI[1] != in_RDI[9]) {
      fVar1 = in_RDI[1];
      in_RDI[1] = in_RDI[9];
      in_RDI[9] = fVar1;
    }
    if (in_RDI[0xb] <= in_RDI[3] && in_RDI[3] != in_RDI[0xb]) {
      fVar1 = in_RDI[3];
      in_RDI[3] = in_RDI[0xb];
      in_RDI[0xb] = fVar1;
    }
    if (in_RDI[0x11] <= in_RDI[5] && in_RDI[5] != in_RDI[0x11]) {
      fVar1 = in_RDI[5];
      in_RDI[5] = in_RDI[0x11];
      in_RDI[0x11] = fVar1;
    }
    if (in_RDI[0x11] <= in_RDI[0xb] && in_RDI[0xb] != in_RDI[0x11]) {
      fVar1 = in_RDI[0xb];
      in_RDI[0xb] = in_RDI[0x11];
      in_RDI[0x11] = fVar1;
    }
    if (in_RDI[0x11] <= in_RDI[9] && in_RDI[9] != in_RDI[0x11]) {
      fVar1 = in_RDI[9];
      in_RDI[9] = in_RDI[0x11];
      in_RDI[0x11] = fVar1;
    }
    if (in_RDI[10] <= in_RDI[4] && in_RDI[4] != in_RDI[10]) {
      fVar1 = in_RDI[4];
      in_RDI[4] = in_RDI[10];
      in_RDI[10] = fVar1;
    }
    if (in_RDI[0xc] <= in_RDI[6] && in_RDI[6] != in_RDI[0xc]) {
      fVar1 = in_RDI[6];
      in_RDI[6] = in_RDI[0xc];
      in_RDI[0xc] = fVar1;
    }
    if (in_RDI[0xe] <= in_RDI[7] && in_RDI[7] != in_RDI[0xe]) {
      fVar1 = in_RDI[7];
      in_RDI[7] = in_RDI[0xe];
      in_RDI[0xe] = fVar1;
    }
    if (in_RDI[6] <= in_RDI[4] && in_RDI[4] != in_RDI[6]) {
      fVar1 = in_RDI[4];
      in_RDI[4] = in_RDI[6];
      in_RDI[6] = fVar1;
    }
    if (in_RDI[7] <= in_RDI[4] && in_RDI[4] != in_RDI[7]) {
      fVar1 = in_RDI[4];
      in_RDI[4] = in_RDI[7];
      in_RDI[7] = fVar1;
    }
    if (in_RDI[0xe] <= in_RDI[0xc] && in_RDI[0xc] != in_RDI[0xe]) {
      fVar1 = in_RDI[0xc];
      in_RDI[0xc] = in_RDI[0xe];
      in_RDI[0xe] = fVar1;
    }
    if (in_RDI[0xe] <= in_RDI[10] && in_RDI[10] != in_RDI[0xe]) {
      fVar1 = in_RDI[10];
      in_RDI[10] = in_RDI[0xe];
      in_RDI[0xe] = fVar1;
    }
    if (in_RDI[7] <= in_RDI[6] && in_RDI[6] != in_RDI[7]) {
      fVar1 = in_RDI[6];
      in_RDI[6] = in_RDI[7];
      in_RDI[7] = fVar1;
    }
    if (in_RDI[0xc] <= in_RDI[10] && in_RDI[10] != in_RDI[0xc]) {
      fVar1 = in_RDI[10];
      in_RDI[10] = in_RDI[0xc];
      in_RDI[0xc] = fVar1;
    }
    if (in_RDI[10] <= in_RDI[6] && in_RDI[6] != in_RDI[10]) {
      fVar1 = in_RDI[6];
      in_RDI[6] = in_RDI[10];
      in_RDI[10] = fVar1;
    }
    if (in_RDI[0x11] <= in_RDI[6] && in_RDI[6] != in_RDI[0x11]) {
      fVar1 = in_RDI[6];
      in_RDI[6] = in_RDI[0x11];
      in_RDI[0x11] = fVar1;
    }
    if (in_RDI[0x11] <= in_RDI[0xc] && in_RDI[0xc] != in_RDI[0x11]) {
      fVar1 = in_RDI[0xc];
      in_RDI[0xc] = in_RDI[0x11];
      in_RDI[0x11] = fVar1;
    }
    if (in_RDI[0x11] <= in_RDI[7] && in_RDI[7] != in_RDI[0x11]) {
      fVar1 = in_RDI[7];
      in_RDI[7] = in_RDI[0x11];
      in_RDI[0x11] = fVar1;
    }
    if (in_RDI[10] <= in_RDI[7] && in_RDI[7] != in_RDI[10]) {
      fVar1 = in_RDI[7];
      in_RDI[7] = in_RDI[10];
      in_RDI[10] = fVar1;
    }
    if (in_RDI[0x12] <= in_RDI[0xc] && in_RDI[0xc] != in_RDI[0x12]) {
      fVar1 = in_RDI[0xc];
      in_RDI[0xc] = in_RDI[0x12];
      in_RDI[0x12] = fVar1;
    }
    if (in_RDI[0xc] <= in_RDI[7] && in_RDI[7] != in_RDI[0xc]) {
      fVar1 = in_RDI[7];
      in_RDI[7] = in_RDI[0xc];
      in_RDI[0xc] = fVar1;
    }
    if (in_RDI[0x12] <= in_RDI[10] && in_RDI[10] != in_RDI[0x12]) {
      fVar1 = in_RDI[10];
      in_RDI[10] = in_RDI[0x12];
      in_RDI[0x12] = fVar1;
    }
    if (in_RDI[0x14] <= in_RDI[0xc] && in_RDI[0xc] != in_RDI[0x14]) {
      fVar1 = in_RDI[0xc];
      in_RDI[0xc] = in_RDI[0x14];
      in_RDI[0x14] = fVar1;
    }
    if (in_RDI[0x14] <= in_RDI[10] && in_RDI[10] != in_RDI[0x14]) {
      fVar1 = in_RDI[10];
      in_RDI[10] = in_RDI[0x14];
      in_RDI[0x14] = fVar1;
    }
    if (in_RDI[0xc] <= in_RDI[10] && in_RDI[10] != in_RDI[0xc]) {
      fVar1 = in_RDI[10];
      in_RDI[10] = in_RDI[0xc];
      in_RDI[0xc] = fVar1;
    }
    t_125 = in_RDI[0xc];
  }
  return t_125;
}

Assistant:

elem_type swap_median(elem_type *arr, int n) {

    /*
     * The following routines have been built from knowledge gathered
     * around the Web. I am not aware of any copyright problem with
     * them, so use it as you want.
     * N. Devillard - 1998
     */
    switch (n) {
    case 3:
        /* found on sci.image.processing */
        {
            PIX_SORT(arr[0], arr[1]);
            PIX_SORT(arr[1], arr[2]);
            PIX_SORT(arr[0], arr[1]);
            return arr[1];
        }
    case 5:
        /* found on sci.image.processing */
        {
            PIX_SORT(arr[0], arr[1]);
            PIX_SORT(arr[3], arr[4]);
            PIX_SORT(arr[0], arr[3]);
            PIX_SORT(arr[1], arr[4]);
            PIX_SORT(arr[1], arr[2]);
            PIX_SORT(arr[2], arr[3]);
            PIX_SORT(arr[1], arr[2]);
            return arr[2];
        }
    case 7:
        /* found on sci.image.processing */
        {
            PIX_SORT(arr[0], arr[5]);
            PIX_SORT(arr[0], arr[3]);
            PIX_SORT(arr[1], arr[6]);
            PIX_SORT(arr[2], arr[4]);
            PIX_SORT(arr[0], arr[1]);
            PIX_SORT(arr[3], arr[5]);
            PIX_SORT(arr[2], arr[6]);
            PIX_SORT(arr[2], arr[3]);
            PIX_SORT(arr[3], arr[6]);
            PIX_SORT(arr[4], arr[5]);
            PIX_SORT(arr[1], arr[4]);
            PIX_SORT(arr[1], arr[3]);
            PIX_SORT(arr[3], arr[4]);
            return arr[3];
        }
    case 9:
        /* Formula from: XILINX XCELL magazine, vol. 23 by John L. Smith
           The input array is modified in the process.
           The result array is guaranteed to contain the median value
           in middle position, but other elements are NOT sorted. */
        {
            PIX_SORT(arr[1], arr[2]);
            PIX_SORT(arr[4], arr[5]);
            PIX_SORT(arr[7], arr[8]);
            PIX_SORT(arr[0], arr[1]);
            PIX_SORT(arr[3], arr[4]);
            PIX_SORT(arr[6], arr[7]);
            PIX_SORT(arr[1], arr[2]);
            PIX_SORT(arr[4], arr[5]);
            PIX_SORT(arr[7], arr[8]);
            PIX_SORT(arr[0], arr[3]);
            PIX_SORT(arr[5], arr[8]);
            PIX_SORT(arr[4], arr[7]);
            PIX_SORT(arr[3], arr[6]);
            PIX_SORT(arr[1], arr[4]);
            PIX_SORT(arr[2], arr[5]);
            PIX_SORT(arr[4], arr[7]);
            PIX_SORT(arr[4], arr[2]);
            PIX_SORT(arr[6], arr[4]);
            PIX_SORT(arr[4], arr[2]);
            return arr[4];
        }
    case 25:
        /* Code taken from Graphic Gems. */
        {
            PIX_SORT(arr[0], arr[1]);
            PIX_SORT(arr[3], arr[4]);
            PIX_SORT(arr[2], arr[4]);
            PIX_SORT(arr[2], arr[3]);
            PIX_SORT(arr[6], arr[7]);
            PIX_SORT(arr[5], arr[7]);
            PIX_SORT(arr[5], arr[6]);
            PIX_SORT(arr[9], arr[10]);
            PIX_SORT(arr[8], arr[10]);
            PIX_SORT(arr[8], arr[9]);
            PIX_SORT(arr[12], arr[13]);
            PIX_SORT(arr[11], arr[13]);
            PIX_SORT(arr[11], arr[12]);
            PIX_SORT(arr[15], arr[16]);
            PIX_SORT(arr[14], arr[16]);
            PIX_SORT(arr[14], arr[15]);
            PIX_SORT(arr[18], arr[19]);
            PIX_SORT(arr[17], arr[19]);
            PIX_SORT(arr[17], arr[18]);
            PIX_SORT(arr[21], arr[22]);
            PIX_SORT(arr[20], arr[22]);
            PIX_SORT(arr[20], arr[21]);
            PIX_SORT(arr[23], arr[24]);
            PIX_SORT(arr[2], arr[5]);
            PIX_SORT(arr[3], arr[6]);
            PIX_SORT(arr[0], arr[6]);
            PIX_SORT(arr[0], arr[3]);
            PIX_SORT(arr[4], arr[7]);
            PIX_SORT(arr[1], arr[7]);
            PIX_SORT(arr[1], arr[4]);
            PIX_SORT(arr[11], arr[14]);
            PIX_SORT(arr[8], arr[14]);
            PIX_SORT(arr[8], arr[11]);
            PIX_SORT(arr[12], arr[15]);
            PIX_SORT(arr[9], arr[15]);
            PIX_SORT(arr[9], arr[12]);
            PIX_SORT(arr[13], arr[16]);
            PIX_SORT(arr[10], arr[16]);
            PIX_SORT(arr[10], arr[13]);
            PIX_SORT(arr[20], arr[23]);
            PIX_SORT(arr[17], arr[23]);
            PIX_SORT(arr[17], arr[20]);
            PIX_SORT(arr[21], arr[24]);
            PIX_SORT(arr[18], arr[24]);
            PIX_SORT(arr[18], arr[21]);
            PIX_SORT(arr[19], arr[22]);
            PIX_SORT(arr[8], arr[17]);
            PIX_SORT(arr[9], arr[18]);
            PIX_SORT(arr[0], arr[18]);
            PIX_SORT(arr[0], arr[9]);
            PIX_SORT(arr[10], arr[19]);
            PIX_SORT(arr[1], arr[19]);
            PIX_SORT(arr[1], arr[10]);
            PIX_SORT(arr[11], arr[20]);
            PIX_SORT(arr[2], arr[20]);
            PIX_SORT(arr[2], arr[11]);
            PIX_SORT(arr[12], arr[21]);
            PIX_SORT(arr[3], arr[21]);
            PIX_SORT(arr[3], arr[12]);
            PIX_SORT(arr[13], arr[22]);
            PIX_SORT(arr[4], arr[22]);
            PIX_SORT(arr[4], arr[13]);
            PIX_SORT(arr[14], arr[23]);
            PIX_SORT(arr[5], arr[23]);
            PIX_SORT(arr[5], arr[14]);
            PIX_SORT(arr[15], arr[24]);
            PIX_SORT(arr[6], arr[24]);
            PIX_SORT(arr[6], arr[15]);
            PIX_SORT(arr[7], arr[16]);
            PIX_SORT(arr[7], arr[19]);
            PIX_SORT(arr[13], arr[21]);
            PIX_SORT(arr[15], arr[23]);
            PIX_SORT(arr[7], arr[13]);
            PIX_SORT(arr[7], arr[15]);
            PIX_SORT(arr[1], arr[9]);
            PIX_SORT(arr[3], arr[11]);
            PIX_SORT(arr[5], arr[17]);
            PIX_SORT(arr[11], arr[17]);
            PIX_SORT(arr[9], arr[17]);
            PIX_SORT(arr[4], arr[10]);
            PIX_SORT(arr[6], arr[12]);
            PIX_SORT(arr[7], arr[14]);
            PIX_SORT(arr[4], arr[6]);
            PIX_SORT(arr[4], arr[7]);
            PIX_SORT(arr[12], arr[14]);
            PIX_SORT(arr[10], arr[14]);
            PIX_SORT(arr[6], arr[7]);
            PIX_SORT(arr[10], arr[12]);
            PIX_SORT(arr[6], arr[10]);
            PIX_SORT(arr[6], arr[17]);
            PIX_SORT(arr[12], arr[17]);
            PIX_SORT(arr[7], arr[17]);
            PIX_SORT(arr[7], arr[10]);
            PIX_SORT(arr[12], arr[18]);
            PIX_SORT(arr[7], arr[12]);
            PIX_SORT(arr[10], arr[18]);
            PIX_SORT(arr[12], arr[20]);
            PIX_SORT(arr[10], arr[20]);
            PIX_SORT(arr[10], arr[12]);
            return arr[12];
        }
    }

    int low = 0, high = n - 1;
    int median, middle, ll, hh;

    median = (low + high) / 2;
    for (;;) {
        if (high <= low)        /* One element only */
            return arr[median];

        if (high == low + 1) {  /* Two elements only */
            if (arr[low] > arr[high])
                ELEM_SWAP(arr[low], arr[high]);
            return arr[median];
        }

        /* Find median of low, middle and high items; swap into position low */
        middle = (low + high) / 2;
        if (arr[middle] > arr[high])
            ELEM_SWAP(arr[middle], arr[high]);
        if (arr[low] > arr[high])
            ELEM_SWAP(arr[low], arr[high]);
        if (arr[middle] > arr[low])
            ELEM_SWAP(arr[middle], arr[low]);

        /* Swap low item (now in position middle) into position (low+1) */
        ELEM_SWAP(arr[middle], arr[low + 1]);

        /* Nibble from each end towards middle, swapping items when stuck */
        ll = low + 1;
        hh = high;
        for (;;) {
            do
                ++ll;
            while (arr[low] > arr[ll]);
            do
                --hh;
            while (arr[hh] > arr[low]);

            if (hh < ll)
                break;

            ELEM_SWAP(arr[ll], arr[hh]);
        }

        /* Swap middle item (in position low) back into correct position */
        ELEM_SWAP(arr[low], arr[hh]);

        /* Re-set active partition */
        if (hh <= median)
            low = ll;
        if (hh >= median)
            high = hh - 1;
    }
}